

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O2

optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(dwarf_resolver *this,die_object *cu_die)

{
  source_location location;
  source_location location_00;
  source_location location_01;
  source_location location_02;
  long lVar1;
  int iVar2;
  cache_mode cVar3;
  iterator iVar4;
  long lVar5;
  die_object *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  __hashtable *__h;
  _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  long lVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false,_false>,_bool>
  pVar8;
  optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> oVar9;
  source_location location_03;
  char *in_stack_fffffffffffffed8;
  undefined7 uStack_120;
  Dwarf_Small table_count;
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  line_entries;
  Dwarf_Addr low_addr;
  Dwarf_Signed line_count;
  die_object *local_e8;
  Dwarf_Addr addr;
  Dwarf_Line_Context line_context;
  undefined1 local_d0 [24];
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  local_b8;
  bool local_a0;
  bool local_94;
  bool local_8c;
  _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_88;
  anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>_2
  local_80;
  Dwarf_Unsigned version;
  Dwarf_Off off;
  Dwarf_Line *line_buffer;
  Dwarf_Line_Context local_60;
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  local_58;
  Dwarf_Signed linecount_actuals;
  Dwarf_Line *linebuf_actuals;
  
  off = die_object::get_global_offset(in_RDX);
  this_00 = (_Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             *)&cu_die[4].die;
  iVar4 = std::
          _Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long_long,_std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_std::allocator<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00,&off);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_d0._0_8_ = (Dwarf_Error)0x0;
    iVar2 = dwarf_srclines_b(in_RDX->die,&version,&table_count,&line_context,(Dwarf_Error *)local_d0
                            );
    if (iVar2 == 1) {
      handle_dwarf_error((Dwarf_Debug)cu_die[2].die,(Dwarf_Error)local_d0._0_8_);
    }
    if (2 < table_count) {
      location_03._8_8_ = "Unknown dwarf line table count";
      location_03.file = (char *)0x27e;
      assert_fail((detail *)0x1,0x1e46e6,
                  "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                  ,location_03,in_stack_fffffffffffffed8);
    }
    if (iVar2 == -1) {
      *(undefined1 *)&(this->object_path)._M_dataplus._M_p = 0;
      uVar6 = extraout_RDX_00;
    }
    else {
      location._8_7_ = uStack_120;
      location.file = in_stack_fffffffffffffed8;
      location._15_1_ = table_count;
      assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x1e479a,
                        "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                        ,location);
      line_entries.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      line_entries.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      line_entries.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cVar3 = get_cache_mode();
      if (cVar3 == prioritize_speed) {
        line_buffer = (Dwarf_Line *)0x0;
        line_count = 0;
        linebuf_actuals = (Dwarf_Line *)0x0;
        linecount_actuals = 0;
        local_d0._0_8_ = (Dwarf_Error)0x0;
        iVar2 = dwarf_srclines_two_level_from_linecontext
                          (line_context,&line_buffer,&line_count,&linebuf_actuals,&linecount_actuals
                           ,(Dwarf_Error *)local_d0);
        if (iVar2 == 1) {
          handle_dwarf_error((Dwarf_Debug)cu_die[2].die,(Dwarf_Error)local_d0._0_8_);
        }
        location_00._8_7_ = uStack_120;
        location_00.file = in_stack_fffffffffffffed8;
        location_00._15_1_ = table_count;
        assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x1e4557,
                          "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                          ,location_00);
        local_e8 = cu_die;
        std::
        vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
        ::reserve(&line_entries,line_count);
        lVar7 = 0;
        local_88 = this_00;
        local_80 = (anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>_2
                    )this;
        while (lVar7 = (long)(int)lVar7, lVar7 < line_count) {
          low_addr = 0;
          local_d0._0_8_ = (Dwarf_Error)0x0;
          iVar2 = dwarf_lineaddr(line_buffer[lVar7],&low_addr,(Dwarf_Error *)local_d0);
          if (iVar2 == 1) {
            handle_dwarf_error((Dwarf_Debug)local_e8[2].die,(Dwarf_Error)local_d0._0_8_);
          }
          location_01._8_7_ = uStack_120;
          location_01.file = in_stack_fffffffffffffed8;
          location_01._15_1_ = table_count;
          assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x1e47ab,
                            "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                            ,location_01);
          lVar1 = lVar7 << 0x20;
          do {
            lVar5 = lVar1;
            lVar7 = lVar7 + 1;
            if (line_count <= lVar7) break;
            addr = 0;
            local_d0._0_8_ = (Dwarf_Error)0x0;
            iVar2 = dwarf_lineaddr(line_buffer[lVar7],&addr,(Dwarf_Error *)local_d0);
            if (iVar2 == 1) {
              handle_dwarf_error((Dwarf_Debug)local_e8[2].die,(Dwarf_Error)local_d0._0_8_);
            }
            location_02._8_7_ = uStack_120;
            location_02.file = in_stack_fffffffffffffed8;
            location_02._15_1_ = table_count;
            assert_impl<bool>((detail *)(ulong)(iVar2 == 0),true,0x1e47de,
                              "optional<std::reference_wrapper<line_table_info>> cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(const die_object &)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O2/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                              ,location_02);
            lVar1 = lVar5 + 0x100000000;
          } while (addr == low_addr);
          local_d0._8_8_ = *(undefined8 *)((long)line_buffer + (lVar5 >> 0x1d));
          local_d0._0_8_ = low_addr;
          local_a0 = false;
          local_94 = false;
          local_8c = false;
          std::
          vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
          ::emplace_back<cpptrace::detail::libdwarf::line_entry>
                    (&line_entries,(line_entry *)local_d0);
          line_entry::~line_entry((line_entry *)local_d0);
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::line_entry*,std::vector<cpptrace::detail::libdwarf::line_entry,std::allocator<cpptrace::detail::libdwarf::line_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<cpptrace::detail::libdwarf::dwarf_resolver::get_line_table(cpptrace::detail::libdwarf::die_object_const&)::_lambda(cpptrace::detail::libdwarf::line_entry_const&,cpptrace::detail::libdwarf::line_entry_const&)_1_>>
                  (line_entries.
                   super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   line_entries.
                   super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        this_00 = local_88;
        this = (dwarf_resolver *)local_80;
      }
      line_buffer = (Dwarf_Line *)version;
      local_60 = line_context;
      local_58.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_start =
           line_entries.
           super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           line_entries.
           super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_58.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           line_entries.
           super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      line_entries.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      line_entries.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      line_entries.
      super__Vector_base<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d0._0_8_ = off;
      line_table_info::line_table_info
                ((line_table_info *)(local_d0 + 8),(line_table_info *)&line_buffer);
      pVar8 = std::
              _Hashtable<unsigned_long_long,std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>,std::allocator<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>,std::__detail::_Select1st,std::equal_to<unsigned_long_long>,std::hash<unsigned_long_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<std::pair<unsigned_long_long_const,cpptrace::detail::libdwarf::line_table_info>>
                        (this_00,local_d0);
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::~vector(&local_b8);
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::~vector(&local_58);
      *(undefined1 *)&(((string *)((long)this + 8))->_M_dataplus)._M_p = 1;
      *(long *)this =
           (long)pVar8.first.
                 super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
           + 0x10;
      std::
      vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
      ::~vector(&line_entries);
      uVar6 = extraout_RDX_01;
    }
  }
  else {
    *(undefined1 *)&(this->object_path)._M_dataplus._M_p = 1;
    (this->super_symbol_resolver)._vptr_symbol_resolver =
         (_func_int **)
         ((long)iVar4.
                super__Node_iterator_base<std::pair<const_unsigned_long_long,_cpptrace::detail::libdwarf::line_table_info>,_false>
                ._M_cur + 0x10);
    uVar6 = extraout_RDX;
  }
  oVar9._8_8_ = uVar6;
  oVar9.field_0 =
       (anon_union_8_2_d41c7fdf_for_optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>_2
        )this;
  return oVar9;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        optional<std::reference_wrapper<line_table_info>> get_line_table(const die_object& cu_die) {
            auto off = cu_die.get_global_offset();
            auto it = line_tables.find(off);
            if(it != line_tables.end()) {
                return it->second;
            } else {
                Dwarf_Unsigned version;
                Dwarf_Small table_count;
                Dwarf_Line_Context line_context;
                int ret = wrap(
                    dwarf_srclines_b,
                    cu_die.get(),
                    &version,
                    &table_count,
                    &line_context
                );
                static_assert(std::is_unsigned<decltype(table_count)>::value, "Expected unsigned Dwarf_Small");
                VERIFY(/*table_count >= 0 &&*/ table_count <= 2, "Unknown dwarf line table count");
                if(ret == DW_DLV_NO_ENTRY) {
                    // TODO: Failing silently for now
                    return nullopt;
                }
                VERIFY(ret == DW_DLV_OK);

                std::vector<line_entry> line_entries;

                if(get_cache_mode() == cache_mode::prioritize_speed) {
                    // build lookup table
                    Dwarf_Line* line_buffer = nullptr;
                    Dwarf_Signed line_count = 0;
                    Dwarf_Line* linebuf_actuals = nullptr;
                    Dwarf_Signed linecount_actuals = 0;
                    VERIFY(
                        wrap(
                            dwarf_srclines_two_level_from_linecontext,
                            line_context,
                            &line_buffer,
                            &line_count,
                            &linebuf_actuals,
                            &linecount_actuals
                        ) == DW_DLV_OK
                    );

                    // TODO: Make any attempt to note PC ranges? Handle line end sequence?
                    line_entries.reserve(line_count);
                    for(int i = 0; i < line_count; i++) {
                        Dwarf_Line line = line_buffer[i];
                        Dwarf_Addr low_addr = 0;
                        VERIFY(wrap(dwarf_lineaddr, line, &low_addr) == DW_DLV_OK);
                        // scan ahead for the last line entry matching this pc
                        int j;
                        for(j = i + 1; j < line_count; j++) {
                            Dwarf_Addr addr = 0;
                            VERIFY(wrap(dwarf_lineaddr, line_buffer[j], &addr) == DW_DLV_OK);
                            if(addr != low_addr) {
                                break;
                            }
                        }
                        line = line_buffer[j - 1];
                        // {
                        //     Dwarf_Unsigned line_number = 0;
                        //     VERIFY(wrap(dwarf_lineno, line, &line_number) == DW_DLV_OK);
                        //     frame.line = static_cast<std::uint32_t>(line_number);
                        //     char* filename = nullptr;
                        //     VERIFY(wrap(dwarf_linesrc, line, &filename) == DW_DLV_OK);
                        //     auto wrapper = raii_wrap(
                        //         filename,
                        //         [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        //     );
                        //     frame.filename = filename;
                        //     printf("%s : %d\n", filename, line_number);
                        //     Dwarf_Bool is_line_end;
                        //     VERIFY(wrap(dwarf_lineendsequence, line, &is_line_end) == DW_DLV_OK);
                        //     if(is_line_end) {
                        //         puts("Line end");
                        //     }
                        // }
                        line_entries.push_back({
                            low_addr,
                            line
                        });
                        i = j - 1;
                    }
                    // sort lines
                    std::sort(line_entries.begin(), line_entries.end(), [] (const line_entry& a, const line_entry& b) {
                        return a.low < b.low;
                    });
                }

                it = line_tables.insert({off, {version, line_context, std::move(line_entries)}}).first;
                return it->second;
            }
        }